

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall QString::append(QString *this,QLatin1StringView str)

{
  size_t size;
  DataPointer *d;
  char *str_00;
  char16_t *dst;
  qsizetype len;
  char *strData;
  
  size = str.m_size;
  str_00 = str.m_data;
  if ((long)size < 1 || str_00 == (char *)0x0) {
    if ((str_00 != (char *)0x0) && ((this->d).ptr == (char16_t *)0x0)) {
      operator=(this,(QLatin1StringView)ZEXT816(0x13b23b));
    }
  }
  else {
    QArrayDataPointer<char16_t>::detachAndGrow
              (&this->d,GrowsAtEnd,size,(char16_t **)0x0,(QArrayDataPointer<char16_t> *)0x0);
    dst = (this->d).ptr + (this->d).size;
    qt_from_latin1(dst,str_00,size);
    resize(this,(long)((long)dst + (size * 2 - (long)(this->d).ptr)) >> 1);
  }
  return this;
}

Assistant:

QString &QString::append(QLatin1StringView str)
{
    append_helper(*this, str);
    return *this;
}